

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

void * mi_os_page_align_areax(_Bool conservative,void *addr,size_t size,size_t *newsize)

{
  void *pvVar1;
  ulong uVar2;
  void *pvVar3;
  size_t sVar4;
  
  if (newsize != (size_t *)0x0) {
    *newsize = 0;
  }
  if (addr == (void *)0x0 || size == 0) {
    return (void *)0x0;
  }
  if (conservative) {
    pvVar3 = (void *)((long)addr + (mi_os_mem_config.page_size - 1));
    if ((mi_os_mem_config.page_size & mi_os_mem_config.page_size - 1) == 0) {
      pvVar3 = (void *)((ulong)pvVar3 & -mi_os_mem_config.page_size);
      goto LAB_004ab6d8;
    }
    uVar2 = (ulong)pvVar3 % mi_os_mem_config.page_size;
  }
  else {
    if ((mi_os_mem_config.page_size & mi_os_mem_config.page_size - 1) == 0) {
      pvVar3 = (void *)(-mi_os_mem_config.page_size & (ulong)addr);
      goto LAB_004ab6d8;
    }
    uVar2 = (ulong)addr % mi_os_mem_config.page_size;
    pvVar3 = addr;
  }
  pvVar3 = (void *)((long)pvVar3 - uVar2);
LAB_004ab6d8:
  uVar2 = (long)addr + size;
  if (!conservative) {
    uVar2 = (uVar2 + mi_os_mem_config.page_size) - 1;
  }
  if ((mi_os_mem_config.page_size & mi_os_mem_config.page_size - 1) == 0) {
    uVar2 = -mi_os_mem_config.page_size & uVar2;
  }
  else {
    uVar2 = uVar2 - uVar2 % mi_os_mem_config.page_size;
  }
  sVar4 = uVar2 - (long)pvVar3;
  pvVar1 = (void *)0x0;
  if (0 < (long)sVar4) {
    pvVar1 = pvVar3;
  }
  if ((newsize != (size_t *)0x0) && (0 < (long)sVar4)) {
    *newsize = sVar4;
    pvVar1 = pvVar3;
  }
  return pvVar1;
}

Assistant:

static void* mi_os_page_align_areax(bool conservative, void* addr, size_t size, size_t* newsize) {
  mi_assert(addr != NULL && size > 0);
  if (newsize != NULL) *newsize = 0;
  if (size == 0 || addr == NULL) return NULL;

  // page align conservatively within the range
  void* start = (conservative ? mi_align_up_ptr(addr, _mi_os_page_size())
    : mi_align_down_ptr(addr, _mi_os_page_size()));
  void* end = (conservative ? mi_align_down_ptr((uint8_t*)addr + size, _mi_os_page_size())
    : mi_align_up_ptr((uint8_t*)addr + size, _mi_os_page_size()));
  ptrdiff_t diff = (uint8_t*)end - (uint8_t*)start;
  if (diff <= 0) return NULL;

  mi_assert_internal((conservative && (size_t)diff <= size) || (!conservative && (size_t)diff >= size));
  if (newsize != NULL) *newsize = (size_t)diff;
  return start;
}